

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CComputeBase::Run<glcts::(anonymous_namespace)::test_api::ES3>
          (CComputeBase *this)

{
  allocator<tcu::Vector<float,_4>_> *paVar1;
  int iVar2;
  GLuint GVar3;
  GLint GVar4;
  int iVar5;
  int iVar6;
  GLuint *pGVar7;
  long lVar8;
  size_type sVar9;
  reference pvVar10;
  runtime_error *prVar11;
  reference pvVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  CallLogWrapper *pCVar16;
  DILogger local_9e8;
  DILogger local_868;
  DILogger local_6e8;
  DILogger local_568;
  undefined1 local_3e8 [8];
  DIResult result;
  Vector<float,_4> local_258;
  undefined1 local_248 [8];
  CColorArray bufferTest;
  Vector<float,_4> local_228;
  undefined1 local_218 [8];
  CColorArray bufferRef4;
  Vector<float,_4> local_1f8;
  undefined1 local_1e8 [8];
  CColorArray bufferRef3;
  Vector<float,_4> local_1c8;
  undefined1 local_1b8 [8];
  CColorArray bufferRef2;
  Vector<float,_4> local_198;
  undefined1 local_188 [8];
  CColorArray bufferRef1;
  ulong local_150;
  size_t i;
  undefined1 local_140 [8];
  CElementArray elements;
  DrawArraysIndirectCommand indirectArrays;
  DrawElementsIndirectCommand indirectElements;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  allocator<tcu::Vector<float,_4>_> local_91;
  Vector<float,_4> local_90;
  undefined1 local_80 [8];
  CColorArray colors;
  allocator<tcu::Vector<float,_4>_> local_51;
  Vector<float,_4> local_50;
  undefined1 local_40 [8];
  CColorArray coords;
  GLuint local_20;
  GLuint local_1c;
  int height;
  int width;
  CComputeBase *this_local;
  
  pCVar16 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  _height = this;
  glu::CallLogWrapper::glGetIntegeri_v(pCVar16,0x91bf,0,(GLint *)&local_1c);
  glu::CallLogWrapper::glGetIntegeri_v(pCVar16,0x91bf,1,(GLint *)&local_20);
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
  pGVar7 = (GLuint *)
           std::min<int>((int *)&local_1c,
                         (int *)((long)&coords.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_1c = *pGVar7;
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
  pGVar7 = (GLuint *)
           std::min<int>((int *)&local_20,
                         (int *)&coords.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_20 = *pGVar7;
  glu::CallLogWrapper::glViewport(pCVar16,0,0,local_1c,local_20);
  iVar2 = local_1c * local_20;
  tcu::Vector<float,_4>::Vector(&local_50,0.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_51);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40,
             (long)iVar2,&local_50,&local_51);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_51);
  iVar2 = local_1c * local_20;
  tcu::Vector<float,_4>::Vector(&local_90,0.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_91);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80,
             (long)iVar2,&local_90,&local_91);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_91);
  Vsh<glcts::(anonymous_namespace)::test_api::ES3>(&local_b8,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
  Fsh<glcts::(anonymous_namespace)::test_api::ES3>
            ((string *)&indirectElements.reservedMustBeZero,this);
  GVar3 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_b8,&local_d8,
                     (string *)&indirectElements.reservedMustBeZero,false);
  this->_program = GVar3;
  std::__cxx11::string::~string((string *)&indirectElements.reservedMustBeZero);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string((string *)&local_b8);
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->_program,0,"in_coords");
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->_program,1,"in_colors");
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->_program);
  lVar8 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar8 == 0) {
    this_local = (CComputeBase *)&DAT_ffffffffffffffff;
    indirectElements.baseVertex = 1;
  }
  else {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_program);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_vao);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferCoords);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_bufferCoords);
    sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_40);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar9 << 4,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferColors);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_bufferColors);
    sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_80);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar9 << 4,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1);
    indirectArrays.first = 0;
    indirectArrays.reservedMustBeZero = 0;
    indirectElements.count = 0;
    indirectElements.primCount = 0;
    indirectElements.firstIndex = 0;
    elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    indirectArrays.count = 0;
    indirectArrays.primCount = 0;
    iVar2 = local_1c * local_20;
    i._4_4_ = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,(long)iVar2,
               (value_type_conflict4 *)((long)&i + 4),(allocator<unsigned_int> *)((long)&i + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i + 3));
    local_150 = 0;
    while( true ) {
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140);
      if (sVar9 <= local_150) break;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,
                           local_150);
      *pvVar10 = (value_type)local_150;
      local_150 = local_150 + 1;
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    if (this->_drawFunc == DRAW_ARRAYS) {
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,0x10,
                 &elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0x88e4);
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"Unknown draw function!");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8893,this->_ebo);
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140);
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8893,sVar9 << 2,pvVar10,0x88e4);
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,0x14,&indirectArrays.first,0x88e4);
    }
    Csh<glcts::(anonymous_namespace)::test_api::ES3>
              ((string *)
               &bufferRef1.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,this);
    GVar3 = DrawIndirectBase::CreateComputeProgram
                      (&this->super_DrawIndirectBase,
                       (string *)
                       &bufferRef1.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
    this->_programCompute = GVar3;
    std::__cxx11::string::~string
              ((string *)
               &bufferRef1.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_programCompute);
    lVar8 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_programCompute);
    if (lVar8 == 0) {
      this_local = (CComputeBase *)&DAT_ffffffffffffffff;
      indirectElements.baseVertex = 1;
    }
    else {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->_programCompute);
      pCVar16 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar16,this->_programCompute,"width");
      glu::CallLogWrapper::glUniform1ui(pCVar16,GVar4,local_1c);
      pCVar16 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(pCVar16,this->_programCompute,"height");
      glu::CallLogWrapper::glUniform1ui(pCVar16,GVar4,local_20);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->_bufferCoords);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->_bufferColors);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,2,this->_bufferIndirect);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_1c,local_20,1);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x2040);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->_program);
      if (this->_drawFunc == DRAW_ARRAYS) {
        glu::CallLogWrapper::glDrawArraysIndirect
                  (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,(void *)0x0);
      }
      else {
        if (this->_drawFunc != DRAW_ELEMENTS) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"Unknown draw function!");
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        glu::CallLogWrapper::glDrawElementsIndirect
                  (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0x1405,(void *)0x0);
      }
      iVar2 = local_1c * local_20;
      if (iVar2 < 0) {
        iVar2 = iVar2 + 3;
      }
      tcu::Vector<float,_4>::Vector(&local_198,0.0,0.0,0.0,1.0);
      paVar1 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferRef2.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_188
                 ,(long)(iVar2 >> 2),&local_198,paVar1);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferRef2.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      iVar2 = local_1c * local_20;
      if (iVar2 < 0) {
        iVar2 = iVar2 + 3;
      }
      tcu::Vector<float,_4>::Vector(&local_1c8,0.5,0.0,0.0,1.0);
      paVar1 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferRef3.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b8
                 ,(long)(iVar2 >> 2),&local_1c8,paVar1);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferRef3.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      iVar2 = local_1c * local_20;
      if (iVar2 < 0) {
        iVar2 = iVar2 + 3;
      }
      tcu::Vector<float,_4>::Vector(&local_1f8,0.0,0.5,0.0,1.0);
      paVar1 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferRef4.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1e8
                 ,(long)(iVar2 >> 2),&local_1f8,paVar1);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferRef4.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      iVar2 = local_1c * local_20;
      if (iVar2 < 0) {
        iVar2 = iVar2 + 3;
      }
      tcu::Vector<float,_4>::Vector(&local_228,0.5,0.5,0.0,1.0);
      paVar1 = (allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218
                 ,(long)(iVar2 >> 2),&local_228,paVar1);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)
                 ((long)&bufferTest.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      iVar2 = local_1c * local_20;
      if (iVar2 < 0) {
        iVar2 = iVar2 + 3;
      }
      tcu::Vector<float,_4>::Vector(&local_258,0.0);
      paVar1 = (allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7);
      std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_248
                 ,(long)(iVar2 >> 2),&local_258,paVar1);
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7));
      DIResult::DIResult((DIResult *)local_3e8);
      iVar2 = (int)local_1c / 2;
      iVar5 = (int)local_20 / 2;
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_248,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,0,iVar2,iVar5,pvVar12);
      lVar8 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_248,(int)local_1c / 2,(int)local_20 / 2,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_188,(int)local_1c / 2,(int)local_20 / 2);
      DIResult::sub_result(&local_568,(DIResult *)local_3e8,lVar8);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_568,(char (*) [29])"Region 0 verification failed");
      DILogger::~DILogger(&local_568);
      iVar13 = local_1c + 1;
      iVar2 = local_1c + 1;
      iVar5 = (int)local_1c / 2;
      iVar6 = (int)local_20 / 2;
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_248,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,iVar2 - (iVar13 >> 0x1f) >> 1,0,iVar5,iVar6,pvVar12);
      lVar8 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_248,(int)local_1c / 2,(int)local_20 / 2,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_1b8,(int)local_1c / 2,(int)local_20 / 2);
      DIResult::sub_result(&local_6e8,(DIResult *)local_3e8,lVar8);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_6e8,(char (*) [29])"Region 1 verification failed");
      DILogger::~DILogger(&local_6e8);
      iVar13 = local_20 + 1;
      iVar2 = local_20 + 1;
      iVar6 = (int)local_1c / 2;
      iVar5 = (int)local_20 / 2;
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_248,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,iVar2 - (iVar13 >> 0x1f) >> 1,iVar6,iVar5,pvVar12);
      lVar8 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_248,(int)local_1c / 2,(int)local_20 / 2,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_1e8,(int)local_1c / 2,(int)local_20 / 2);
      DIResult::sub_result(&local_868,(DIResult *)local_3e8,lVar8);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_868,(char (*) [29])"Region 2 verification failed");
      DILogger::~DILogger(&local_868);
      iVar14 = local_1c + 1;
      iVar2 = local_1c + 1;
      iVar15 = local_20 + 1;
      iVar5 = local_20 + 1;
      iVar13 = (int)local_1c / 2;
      iVar6 = (int)local_20 / 2;
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_248,0);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,iVar2 - (iVar14 >> 0x1f) >> 1,
                 iVar5 - (iVar15 >> 0x1f) >> 1,iVar13,iVar6,pvVar12);
      lVar8 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_248,(int)local_1c / 2,(int)local_20 / 2,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_218,(int)local_1c / 2,(int)local_20 / 2);
      DIResult::sub_result(&local_9e8,(DIResult *)local_3e8,lVar8);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_9e8,(char (*) [29])"Region 3 verification failed");
      DILogger::~DILogger(&local_9e8);
      this_local = (CComputeBase *)DIResult::code((DIResult *)local_3e8);
      indirectElements.baseVertex = 1;
      DIResult::~DIResult((DIResult *)local_3e8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_248
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1e8
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b8
                );
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_188
                );
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140);
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  return (long)this_local;
}

Assistant:

long Run()
	{

		int width, height;
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &width);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 1, &height);

		width  = std::min(width, getWindowWidth());
		height = std::min(height, getWindowHeight());

		glViewport(0, 0, width, height);

		CColorArray coords(width * height, tcu::Vec4(0));
		CColorArray colors(width * height, tcu::Vec4(0));

		_program = CreateProgram(Vsh<api>(), "", Fsh<api>(), false);
		glBindAttribLocation(_program, 0, "in_coords");
		glBindAttribLocation(_program, 1, "in_colors");
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_bufferCoords);
		glBindBuffer(GL_ARRAY_BUFFER, _bufferCoords);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), 0, GL_STREAM_DRAW);

		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferColors);
		glBindBuffer(GL_ARRAY_BUFFER, _bufferColors);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(colors.size() * sizeof(colors[0])), 0, GL_STREAM_DRAW);

		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(1);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };

		CElementArray elements(width * height, 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectArrays, GL_STATIC_DRAW);
		}
		break;
		case DRAW_ELEMENTS:
		{
			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements,
						 GL_STATIC_DRAW);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		_programCompute = CreateComputeProgram(Csh<api>(), false);
		glLinkProgram(_programCompute);
		if (!CheckProgram(_programCompute))
		{
			return ERROR;
		}
		glUseProgram(_programCompute);
		glUniform1ui(glGetUniformLocation(_programCompute, "width"), width);
		glUniform1ui(glGetUniformLocation(_programCompute, "height"), height);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, _bufferCoords);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, _bufferColors);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, _bufferIndirect);

		glDispatchCompute(width, height, 1);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT | GL_SHADER_STORAGE_BARRIER_BIT);

		glUseProgram(_program);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			glDrawArraysIndirect(GL_POINTS, 0);
		}
		break;
		case DRAW_ELEMENTS:
		{
			glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, 0);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef1(width * height / 4, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		CColorArray bufferRef2(width * height / 4, tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f));
		CColorArray bufferRef3(width * height / 4, tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f));
		CColorArray bufferRef4(width * height / 4, tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f));
		CColorArray bufferTest(width * height / 4, tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef1, width / 2, height / 2))
			<< "Region 0 verification failed";

		ReadPixelsFloat<api>((width + 1) / 2, 0, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef2, width / 2, height / 2))
			<< "Region 1 verification failed";

		ReadPixelsFloat<api>(0, (height + 1) / 2, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef3, width / 2, height / 2))
			<< "Region 2 verification failed";

		ReadPixelsFloat<api>((width + 1) / 2, (height + 1) / 2, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef4, width / 2, height / 2))
			<< "Region 3 verification failed";

		return result.code();
	}